

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

Expression *
slang::ast::MemberAccessExpression::fromSyntax
          (Compilation *compilation,MemberAccessExpressionSyntax *syntax,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  bool bVar1;
  Expression *pEVar2;
  Diagnostic *this;
  string_view sVar3;
  SourceRange SVar4;
  MemberSelector local_58;
  
  sVar3 = parsing::Token::valueText(&syntax->name);
  pEVar2 = Expression::selfDetermined
                     (compilation,(syntax->left).ptr,context,(bitmask<slang::ast::ASTFlags>)0x0);
  bVar1 = Expression::bad(pEVar2);
  if (sVar3._M_len == 0 || bVar1) {
    pEVar2 = Expression::badExpr(compilation,pEVar2);
    return pEVar2;
  }
  local_58.dotLocation = (SourceLocation)0x0;
  local_58.nameRange = (SourceRange)ZEXT816(0);
  local_58.name = sVar3;
  local_58.dotLocation = parsing::Token::location(&syntax->dot);
  local_58.nameRange = parsing::Token::range(&syntax->name);
  pEVar2 = fromSelector(compilation,pEVar2,&local_58,invocation,withClause,context,false);
  if (pEVar2->kind != Call) {
    bVar1 = Expression::bad(pEVar2);
    if (!bVar1) {
      if (invocation == (InvocationExpressionSyntax *)0x0) {
        if (withClause != (ArrayOrRandomizeMethodExpressionSyntax *)0x0) {
          SVar4 = parsing::Token::range(&withClause->with);
          ASTContext::addDiag(context,(DiagCode)0xa50007,SVar4);
        }
      }
      else {
        SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)invocation);
        this = ASTContext::addDiag(context,(DiagCode)0x570007,SVar4);
        Diagnostic::operator<<(this,local_58.nameRange);
        pEVar2 = Expression::badExpr(compilation,pEVar2);
      }
    }
  }
  return pEVar2;
}

Assistant:

Expression& MemberAccessExpression::fromSyntax(
    Compilation& compilation, const MemberAccessExpressionSyntax& syntax,
    const InvocationExpressionSyntax* invocation,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context) {

    auto name = syntax.name.valueText();
    Expression& lhs = selfDetermined(compilation, *syntax.left, context);
    if (lhs.bad() || name.empty())
        return badExpr(compilation, &lhs);

    LookupResult::MemberSelector selector;
    selector.name = name;
    selector.dotLocation = syntax.dot.location();
    selector.nameRange = syntax.name.range();

    auto& result = fromSelector(compilation, lhs, selector, invocation, withClause, context,
                                /* isFromLookupChain */ false);

    if (result.kind != ExpressionKind::Call && !result.bad()) {
        if (invocation) {
            auto& diag = context.addDiag(diag::ExpressionNotCallable, invocation->sourceRange());
            diag << selector.nameRange;
            return badExpr(compilation, &result);
        }

        if (withClause)
            context.addDiag(diag::UnexpectedWithClause, withClause->with.range());
    }

    return result;
}